

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O3

bool __thiscall adios2::core::engine::DataManWriter::IsBufferQueueEmpty(DataManWriter *this)

{
  _Elt_pointer psVar1;
  _Elt_pointer psVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_BufferQueueMutex);
  if (iVar3 == 0) {
    psVar1 = (this->m_BufferQueue).c.
             super__Deque_base<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    psVar2 = (this->m_BufferQueue).c.
             super__Deque_base<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_BufferQueueMutex);
    return psVar1 == psVar2;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool DataManWriter::IsBufferQueueEmpty()
{
    std::lock_guard<std::mutex> l(m_BufferQueueMutex);
    return m_BufferQueue.empty();
}